

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_split_lastCharDelimiter_fn(int _i)

{
  AString string_00;
  int iVar1;
  ASplittedString *splitted_00;
  size_t sVar2;
  char *in_stack_fffffffffffffdf0;
  uintmax_t _ck_y_13;
  uintmax_t _ck_x_18;
  uintmax_t _ck_y_12;
  uintmax_t _ck_x_17;
  char *_ck_y_q_3;
  char *_ck_x_q_3;
  char *_ck_y_s_3;
  char *_ck_x_s_3;
  char *_ck_y_11;
  char *_ck_x_16;
  void *_ck_x_15;
  uintmax_t _ck_y_10;
  uintmax_t _ck_x_14;
  uintmax_t _ck_y_9;
  uintmax_t _ck_x_13;
  char *_ck_y_q_2;
  char *_ck_x_q_2;
  char *_ck_y_s_2;
  char *_ck_x_s_2;
  char *_ck_y_8;
  char *_ck_x_12;
  void *_ck_x_11;
  uintmax_t _ck_y_7;
  uintmax_t _ck_x_10;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_9;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_5;
  char *_ck_x_8;
  void *_ck_x_7;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_6;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_5;
  void *_ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  ASplittedString *splitted;
  AString string;
  int _i_local;
  
  string.buffer._4_4_ = _i;
  private_ACUtilsTest_AString_constructTestString((AString *)&splitted,"0123456;",8);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  splitted_00 = AString_split((AString *)&splitted,';',false);
  if (string.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa19,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (8)",
                      "(string).capacity",string.size,"(8)",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa19);
  if (string.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa19,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa19);
  _ck_y_s = (char *)string.capacity;
  if (string.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar1 = strcmp("0123456;",(char *)string.capacity);
    if (iVar1 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa19);
      if (string.deallocator != (ACUtilsDeallocator)0x8) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa19,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).size == strlen(\"0123456;\")","(string).size",string.deallocator
                          ,"strlen(\"0123456;\")",8,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa19);
      if (splitted_00 == (ASplittedString *)0x0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa1a,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) splitted != NULL",
                          "(void*) splitted",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa1a);
      sVar2 = private_ACUtils_ADynArray_size(splitted_00);
      if (sVar2 != 2) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa1b,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtils_ADynArray_size(splitted) == 2",
                          "private_ACUtils_ADynArray_size(splitted)",sVar2,"2",2,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa1b);
      sVar2 = (*splitted_00->buffer)->capacity;
      if (sVar2 == 8) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa1c);
        if ((*splitted_00->buffer)->buffer == (char *)0x0) {
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa1c,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x",
                            "(void*) (*(splitted->buffer[0])).buffer != NULL",
                            "(void*) (*(splitted->buffer[0])).buffer",0,0);
        }
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa1c);
        _ck_y_s_1 = (*splitted_00->buffer)->buffer;
        if (_ck_y_s_1 == (char *)0x0) {
          _ck_y_q_1 = "";
          _ck_y_s_1 = "(null)";
        }
        else {
          _ck_y_q_1 = "\"";
          iVar1 = strcmp("0123456",_ck_y_s_1);
          if (iVar1 == 0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa1c);
            sVar2 = (*splitted_00->buffer)->size;
            if (sVar2 != 7) {
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa1c,"Assertion \'_ck_x == _ck_y\' failed",
                                "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                "(*(splitted->buffer[0])).size == strlen(\"0123456\")",
                                "(*(splitted->buffer[0])).size",sVar2,"strlen(\"0123456\")",7,0);
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa1c);
            sVar2 = splitted_00->buffer[1]->capacity;
            if (sVar2 != 8) {
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa1d,"Assertion \'_ck_x == _ck_y\' failed",
                                "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                "(*(splitted->buffer[1])).capacity == (8)",
                                "(*(splitted->buffer[1])).capacity",sVar2,"(8)",8,0);
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa1d);
            if (splitted_00->buffer[1]->buffer == (char *)0x0) {
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa1d,"Assertion \'_ck_x != NULL\' failed",
                                "Assertion \'%s\' failed: %s == %#x",
                                "(void*) (*(splitted->buffer[1])).buffer != NULL",
                                "(void*) (*(splitted->buffer[1])).buffer",0,0);
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa1d);
            _ck_y_s_2 = splitted_00->buffer[1]->buffer;
            if (_ck_y_s_2 == (char *)0x0) {
              _ck_y_q_2 = "";
              _ck_y_s_2 = "(null)";
            }
            else {
              _ck_y_q_2 = "\"";
              iVar1 = strcmp("",_ck_y_s_2);
              if (iVar1 == 0) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa1d);
                sVar2 = splitted_00->buffer[1]->size;
                if (sVar2 != 0) {
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa1d,"Assertion \'_ck_x == _ck_y\' failed",
                                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                    "(*(splitted->buffer[1])).size == strlen(\"\")",
                                    "(*(splitted->buffer[1])).size",sVar2,"strlen(\"\")",0,0);
                }
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa1d);
                AString_freeSplitted(splitted_00);
                if (string.size != 8) {
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa1f,"Assertion \'_ck_x == _ck_y\' failed",
                                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                    "(string).capacity == (8)","(string).capacity",string.size,"(8)"
                                    ,8,0);
                }
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa1f);
                if (string.capacity == 0) {
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa1f,"Assertion \'_ck_x != NULL\' failed",
                                    "Assertion \'%s\' failed: %s == %#x",
                                    "(void*) (string).buffer != NULL","(void*) (string).buffer",0,0)
                  ;
                }
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa1f);
                _ck_y_s_3 = (char *)string.capacity;
                if (string.capacity == 0) {
                  _ck_y_q_3 = "";
                  _ck_y_s_3 = "(null)";
                }
                else {
                  _ck_y_q_3 = "\"";
                  iVar1 = strcmp("0123456;",(char *)string.capacity);
                  if (iVar1 == 0) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa1f);
                    if (string.deallocator != (ACUtilsDeallocator)0x8) {
                      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0xa1f,"Assertion \'_ck_x == _ck_y\' failed",
                                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                        "(string).size == strlen(\"0123456;\")","(string).size",
                                        string.deallocator,"strlen(\"0123456;\")",8,0);
                    }
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa1f);
                    if (private_ACUtilsTest_AString_reallocCount ==
                        private_ACUtilsTest_AString_freeCount) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0xa20);
                      string_00.deallocator = string.deallocator;
                      string_00.reallocator = string.reallocator;
                      string_00.size = string.size;
                      string_00.capacity = string.capacity;
                      string_00.buffer = in_stack_fffffffffffffdf0;
                      private_ACUtilsTest_AString_destructTestString(string_00);
                      return;
                    }
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0xa20,"Assertion \'_ck_x == _ck_y\' failed",
                                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                      "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)"
                                      ,"private_ACUtilsTest_AString_reallocCount",
                                      private_ACUtilsTest_AString_reallocCount,
                                      "(private_ACUtilsTest_AString_freeCount)",
                                      private_ACUtilsTest_AString_freeCount,0);
                  }
                }
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0xa1f,
                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                  ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                  "(string).buffer == (\"0123456;\")","(string).buffer",_ck_y_q_3,
                                  _ck_y_s_3,_ck_y_q_3,"(\"0123456;\")","\"","0123456;","\"",0);
              }
            }
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0xa1d,
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                              "(*(splitted->buffer[1])).buffer == (\"\")",
                              "(*(splitted->buffer[1])).buffer",_ck_y_q_2,_ck_y_s_2,_ck_y_q_2,
                              "(\"\")","\"","","\"",0);
          }
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa1c,
                          "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                          ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                          "(*(splitted->buffer[0])).buffer == (\"0123456\")",
                          "(*(splitted->buffer[0])).buffer",_ck_y_q_1,_ck_y_s_1,_ck_y_q_1,
                          "(\"0123456\")","\"","0123456","\"",0);
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa1c,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                        "(*(splitted->buffer[0])).capacity == (8)",
                        "(*(splitted->buffer[0])).capacity",sVar2,"(8)",8,0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa19,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string).buffer == (\"0123456;\")","(string).buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                    "(\"0123456;\")","\"","0123456;","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_split_lastCharDelimiter)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("0123456;", 8);
    struct ASplittedString *splitted;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    splitted = AString_split(&string, ';', false);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "0123456;", 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(splitted);
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_size(splitted), 2);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 0), "0123456", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 1), "", 8);
    AString_freeSplitted(splitted);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "0123456;", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_destructTestString(string);
}